

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExtWrenchesAndJointTorquesEstimator.cpp
# Opt level: O3

bool __thiscall
iDynTree::ExtWrenchesAndJointTorquesEstimator::loadModelAndSensorsFromFileWithSpecifiedDOFs
          (ExtWrenchesAndJointTorquesEstimator *this,string *filename,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *consideredDOFs,string *filetype)

{
  char cVar1;
  bool bVar2;
  Model *pMVar3;
  SensorsList *pSVar4;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  _Var5;
  ulong uVar6;
  long lVar7;
  ModelLoader loader;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ftJointNames;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  consideredJoints;
  SensorsList _sensorsReduced;
  SensorsList _sensorsFull;
  Model _modelFull;
  Model _modelReduced;
  ModelLoader local_2f0 [8];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_2e8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_2d0;
  SensorsList local_2b8 [16];
  SensorsList local_2a8 [16];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_298 [13];
  Model local_160 [304];
  
  iDynTree::ModelLoader::ModelLoader(local_2f0);
  local_298[0].
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_298[0].
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_298[0].
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  cVar1 = iDynTree::ModelLoader::loadModelFromFile
                    ((string *)local_2f0,(string *)filename,(vector *)filetype);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(local_298);
  if (cVar1 == '\0') {
    iDynTree::reportError
              ("ExtWrenchesAndJointTorquesEstimator","loadModelAndSensorsFromFileWithSpecifiedDOFs",
               "Error in parsing from URDF.");
    bVar2 = false;
  }
  else {
    pMVar3 = (Model *)iDynTree::ModelLoader::model();
    iDynTree::Model::Model((Model *)local_298,pMVar3);
    pSVar4 = (SensorsList *)iDynTree::ModelLoader::sensors();
    iDynTree::SensorsList::SensorsList(local_2a8,pSVar4);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector(&local_2d0,consideredDOFs);
    local_2e8.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_2e8.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_2e8.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    getFTJointNames(local_2a8,&local_2e8);
    if (local_2e8.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish !=
        local_2e8.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start) {
      lVar7 = 0;
      uVar6 = 0;
      do {
        _Var5 = std::
                __find_if<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,__gnu_cxx::__ops::_Iter_equals_val<std::__cxx11::string_const>>
                          (local_2d0.
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start,
                           local_2d0.
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_finish,
                           (long)&((local_2e8.
                                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p +
                           lVar7);
        if (_Var5._M_current ==
            local_2d0.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish) {
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::push_back(&local_2d0,
                      (value_type *)
                      ((long)&((local_2e8.
                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p +
                      lVar7));
        }
        uVar6 = uVar6 + 1;
        lVar7 = lVar7 + 0x20;
      } while (uVar6 < (ulong)((long)local_2e8.
                                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     ._M_impl.super__Vector_impl_data._M_finish -
                               (long)local_2e8.
                                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     ._M_impl.super__Vector_impl_data._M_start >> 5));
    }
    iDynTree::Model::Model(local_160);
    iDynTree::SensorsList::SensorsList(local_2b8);
    cVar1 = iDynTree::createReducedModelAndSensors
                      ((Model *)local_298,local_2a8,(vector *)&local_2d0,local_160,local_2b8);
    if (cVar1 == '\0') {
      iDynTree::reportError
                ("ExtWrenchesAndJointTorquesEstimator",
                 "loadModelAndSensorsFromFileWithSpecifiedDOFs",
                 "Error in creating reduced model and sensors.");
      bVar2 = false;
    }
    else {
      bVar2 = setModelAndSensors(this,local_160,local_2b8);
    }
    iDynTree::SensorsList::~SensorsList(local_2b8);
    iDynTree::Model::~Model(local_160);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_2e8);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_2d0);
    iDynTree::SensorsList::~SensorsList(local_2a8);
    iDynTree::Model::~Model((Model *)local_298);
  }
  iDynTree::ModelLoader::~ModelLoader(local_2f0);
  return bVar2;
}

Assistant:

bool ExtWrenchesAndJointTorquesEstimator::loadModelAndSensorsFromFileWithSpecifiedDOFs(const std::string filename,
                                                                                       const std::vector< std::string >& consideredDOFs,
                                                                                       const std::string filetype)
{
    ModelLoader loader;
    if (!loader.loadModelFromFile(filename, filetype)) {
        reportError("ExtWrenchesAndJointTorquesEstimator", "loadModelAndSensorsFromFileWithSpecifiedDOFs", "Error in parsing from URDF.");
        return false;
    }

    Model _modelFull = loader.model();
    SensorsList _sensorsFull = loader.sensors();

    // We need to create a reduced model, inclusing only the consideredDOFs and the joints used by the FT sensors
    std::vector< std::string > consideredJoints = consideredDOFs;

    // Add FT joints (if they are not already in the consideredDOFs list
    std::vector< std::string > ftJointNames;
    getFTJointNames(_sensorsFull,ftJointNames);

    for (size_t i = 0; i < ftJointNames.size(); i++)
    {
        // Only add an F/T sensor joint if it is not already in consideredDOFs
        if (std::find(consideredJoints.begin(), consideredJoints.end(), ftJointNames[i]) == consideredJoints.end())
        {
            consideredJoints.push_back(ftJointNames[i]);
        }
    }


    Model _modelReduced;
    SensorsList _sensorsReduced;

    bool parsingCorrect = createReducedModelAndSensors(_modelFull,_sensorsFull,consideredJoints,_modelReduced,_sensorsReduced);

    if (!parsingCorrect)
    {
        reportError("ExtWrenchesAndJointTorquesEstimator","loadModelAndSensorsFromFileWithSpecifiedDOFs","Error in creating reduced model and sensors.");
        return false;
    }

    return setModelAndSensors(_modelReduced,_sensorsReduced);
}